

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCEXP.hpp
# Opt level: O0

int __thiscall
CCEXP::CCEXPMat<unsigned_long>::AddValue(CCEXPMat<unsigned_long> *this,unsigned_long val)

{
  reference this_00;
  undefined1 local_68 [8];
  MVECTOR<unsigned_long> dl;
  size_t N;
  unsigned_long val_local;
  CCEXPMat<unsigned_long> *this_local;
  
  if ((this->IgnoreM & 1U) == 0) {
    dl.sptr.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::
         vector<ns_MVECTOR::MVECTOR<unsigned_long>,_std::allocator<ns_MVECTOR::MVECTOR<unsigned_long>_>_>
         ::size(&this->data);
    if ((dl.sptr.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) || ((this->newRowFlag & 1U) == 1)) {
      ns_MVECTOR::MVECTOR<unsigned_long>::MVECTOR((MVECTOR<unsigned_long> *)local_68);
      ns_MVECTOR::MVECTOR<unsigned_long>::clear((MVECTOR<unsigned_long> *)local_68);
      std::
      vector<ns_MVECTOR::MVECTOR<unsigned_long>,_std::allocator<ns_MVECTOR::MVECTOR<unsigned_long>_>_>
      ::push_back(&this->data,(MVECTOR<unsigned_long> *)local_68);
      this->newRowFlag = false;
      ns_MVECTOR::MVECTOR<unsigned_long>::~MVECTOR((MVECTOR<unsigned_long> *)local_68);
    }
    this_00 = std::
              vector<ns_MVECTOR::MVECTOR<unsigned_long>,_std::allocator<ns_MVECTOR::MVECTOR<unsigned_long>_>_>
              ::back(&this->data);
    ns_MVECTOR::MVECTOR<unsigned_long>::push_back(this_00,val);
  }
  return 0;
}

Assistant:

int CCEXPMat<T>::AddValue(T val) {
	if (IgnoreM) return 0; // This is not an error - We just ignore the Table...
	const size_t N = data.size();
	if ((N == 0) || (newRowFlag==true)) {
		MVECTOR<T> dl; dl.clear(); data.push_back(dl);
		newRowFlag = false;
	}
	data.back().push_back(val);
	return 0;
}